

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O0

int compare_ul(void *v1,void *v2)

{
  unsigned_long *ul2;
  unsigned_long *ul1;
  void *v2_local;
  void *v1_local;
  undefined4 local_4;
  
  if (*v1 < *v2) {
    local_4 = -1;
  }
  else if (*v2 < *v1) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int compare_ul(const void *v1, const void *v2) {
  const unsigned long *ul1 = (const unsigned long *)v1,
                      *ul2 = (const unsigned long *)v2;

  if (*ul1 < *ul2) {
    return -1;
  }
  if (*ul1 > *ul2) {
    return 1;
  }
  return 0;
}